

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,4>,tcu::Vector<float,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  ostringstream *poVar1;
  _Rb_tree_node_base *p_Var2;
  float fVar3;
  pointer pVVar4;
  pointer pVVar5;
  Variable<tcu::Vector<float,_4>_> *pVVar6;
  pointer pcVar7;
  Variable<float> *pVVar8;
  double dVar9;
  PrecisionCase *pPVar10;
  FloatFormat *fmt;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  TestError *this_00;
  uint uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  Vector<float,_4> *val;
  MessageBuilder *pMVar25;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  *pVVar26;
  byte bVar27;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  outputs;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  string local_588;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  *local_560;
  pointer local_558;
  PrecisionCase *local_550;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_548;
  long local_540;
  size_t local_538;
  Statement *local_530;
  ulong local_528;
  undefined1 local_520 [16];
  undefined1 local_510 [80];
  string local_4c0;
  ResultCollector *local_4a0;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  double local_478;
  Data local_470;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2f0;
  pointer local_2c0;
  FloatFormat *local_2b8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  local_2b0;
  undefined1 local_280 [16];
  _Base_ptr local_270;
  _Rb_tree_node_base *local_268;
  _Rb_tree_node_base *local_260;
  double local_258;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar27 = 0;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_538 = (long)pVVar5 - (long)pVVar4 >> 4;
  local_560 = variables;
  local_548 = inputs;
  local_530 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  ::Outputs(&local_2b0,local_538);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_318.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f0._M_impl.super__Rb_tree_header._M_header;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_498 + 8);
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Statement: ",0xb);
  (*local_530->_vptr_Statement[2])(local_530,poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_280 + 8);
  local_280._8_4_ = _S_red;
  local_270 = (_Base_ptr)0x0;
  local_258 = 0.0;
  local_558 = pVVar4;
  local_268 = p_Var2;
  local_260 = p_Var2;
  (*local_530->_vptr_Statement[4])(local_530,local_280);
  if (local_268 != p_Var2) {
    p_Var15 = local_268;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var2);
  }
  if (local_258 != 0.0) {
    local_498._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_520._0_8_ != local_510) {
      operator_delete((void *)local_520._0_8_,local_510._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"precision ",10);
  pcVar16 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)&local_588 + (int)*(undefined8 *)(local_498._0_8_ + -0x18) + 0xf0);
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar7 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar26 = local_560;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_488._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_488._8_8_ = plVar18[3];
      local_498._0_8_ = &local_488;
    }
    else {
      local_488._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_498._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_498._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    pVVar26 = local_560;
    if ((pointer)local_1a8._0_8_ != pcVar7) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<float>((Symbol *)local_498,this,
                    (pVVar26->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  pVVar26 = local_560;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,this,
             (pVVar26->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,this,
             (local_560->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  pVVar26 = local_560;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,this,
             (pVVar26->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  (*local_530->_vptr_Statement[2])(local_530,local_498);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar19 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_498._0_8_ =
       (local_548->in0).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_498._8_8_ =
       (local_548->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_488._M_allocated_capacity =
       (size_type)
       (local_548->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._8_8_ =
       (local_548->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2b0.out0.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2b0.out1.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_538,local_498,local_1a8);
  local_550 = this;
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  pVVar26 = local_560;
  lVar20 = 0x10;
  do {
    local_4c0.field_2._M_local_buf[lVar20 + 8] = '\0';
    *(undefined8 *)((long)&local_4a0 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    local_4c0.field_2._M_local_buf[lVar20 + 8] = '\0';
    *(undefined8 *)((long)&local_4a0 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  local_520._0_8_ = local_520._0_8_ & 0xffffffffffffff00;
  local_520._8_8_ = INFINITY;
  local_510._0_8_ = -INFINITY;
  lVar20 = 0x10;
  do {
    local_1b8._M_local_buf[lVar20] = '\0';
    *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    local_1b8._M_local_buf[lVar20] = '\0';
    *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    local_280[lVar20 + -0x10] = 0;
    *(undefined8 *)(local_280 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_280 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    local_280[lVar20 + -0x10] = 0;
    *(undefined8 *)(local_280 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_280 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2f0,
             (local_560->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_498);
  Environment::bind<float>
            ((Environment *)&local_2f0,
             (pVVar26->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_520);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2f0,
             (pVVar26->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_588);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2f0,
             (pVVar26->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)(local_510 + 0x50));
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2f0,
             (pVVar26->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2f0,
             (pVVar26->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_280);
  if (pVVar5 == local_558) {
    local_528 = 0;
  }
  else {
    local_4a0 = &local_550->m_status;
    local_2c0 = (pointer)(local_538 + (local_538 == 0));
    local_558 = (pointer)0x0;
    local_528 = 0;
    local_2b8 = &(this->m_ctx).floatFormat;
    do {
      lVar20 = 0x10;
      do {
        local_1b8._M_local_buf[lVar20] = '\0';
        *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        local_1b8._M_local_buf[lVar20] = '\0';
        *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        local_280[lVar20 + -0x10] = 0;
        *(undefined8 *)(local_280 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        local_280[lVar20 + -0x10] = 0;
        *(undefined8 *)(local_280 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      if (((ulong)local_558 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_550->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_2b8;
      local_540 = (long)local_558 * 0x10;
      pVVar4 = (local_548->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (long)local_558;
      local_588._M_dataplus._M_p = *(pointer *)pVVar4->m_data;
      local_588._M_string_length = *(size_type *)(pVVar4->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_520,local_2b8,(Vector<float,_4> *)&local_588);
      pVVar26 = local_560;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,fmt,(IVal *)local_520);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2f0,
                           (pVVar26->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar25 = (MessageBuilder *)local_498;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar25->m_log;
        pMVar25 = (MessageBuilder *)((long)pMVar25 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      fVar3 = (local_548->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[(long)local_558];
      dVar9 = (double)fVar3;
      bVar12 = NAN(fVar3);
      local_498[0] = bVar12;
      local_498._8_8_ = INFINITY;
      if (!bVar12) {
        local_498._8_8_ = dVar9;
      }
      local_488._M_allocated_capacity = (size_type)-INFINITY;
      if (!bVar12) {
        local_488._M_allocated_capacity = (size_type)dVar9;
      }
      tcu::FloatFormat::roundOut((Interval *)&local_588,fmt,(Interval *)local_498,false);
      tcu::FloatFormat::convert((Interval *)local_520,fmt,(Interval *)&local_588);
      pIVar22 = Environment::lookup<float>
                          ((Environment *)&local_2f0,
                           (pVVar26->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar22->m_hi = (double)local_510._0_8_;
      *(undefined8 *)pIVar22 = local_520._0_8_;
      pIVar22->m_lo = (double)local_520._8_8_;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2f0,
                 (pVVar26->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2f0,
                 (pVVar26->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_470.basic.type = (local_550->m_ctx).precision;
      local_478 = fmt->m_maxValue;
      local_498._0_8_ = *(undefined8 *)fmt;
      local_498._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_488._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_488._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_460 = 0;
      local_470._8_8_ = &local_2f0;
      (*local_530->_vptr_Statement[3])(local_530,(MessageBuilder *)local_498);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2f0,
                           (pVVar26->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar21);
      pMVar25 = (MessageBuilder *)local_498;
      pIVar21 = (IVal *)local_280;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar25->m_log;
        pMVar25 = (MessageBuilder *)((long)pMVar25 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar12 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_280,
                          (Vector<float,_4> *)
                          ((long)(local_2b0.out1.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + local_540));
      local_498._0_8_ = &local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_4a0,bVar12,(string *)local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._M_allocated_capacity + 1));
      }
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2f0,
                           (local_560->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar21);
      pMVar25 = (MessageBuilder *)local_498;
      pIVar21 = (IVal *)local_1a8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar25->m_log;
        pMVar25 = (MessageBuilder *)((long)pMVar25 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar13 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_1a8,
                          (Vector<float,_4> *)
                          ((long)(local_2b0.out0.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + local_540));
      local_498._0_8_ = &local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_4a0,bVar13,(string *)local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._M_allocated_capacity + 1));
      }
      uVar23 = (int)local_528 + ((byte)~(bVar12 && bVar13) & 1);
      local_528 = (ulong)uVar23;
      poVar1 = (ostringstream *)(local_498 + 8);
      if ((int)uVar23 < 0x65 && (!bVar12 || !bVar13)) {
        local_498._0_8_ = ((local_550->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        pcVar16 = "Failed";
        if (bVar12 && bVar13) {
          pcVar16 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar16,6);
        pVVar26 = local_560;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar6 = (pVVar26->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        val = (Vector<float,_4> *)local_510;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_520._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_588,(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)
                   ((long)((local_548->in0).
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_540),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_588._M_dataplus._M_p,local_588._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_520._0_8_ != (Vector<float,_4> *)local_510) {
          operator_delete((void *)local_520._0_8_,local_510._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar8 = (pVVar26->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_520._0_8_ = local_510;
        pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<float>
                  (&local_588,&local_318,
                   (local_548->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)local_558);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_588._M_dataplus._M_p,local_588._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_520._0_8_ != local_510) {
          operator_delete((void *)local_520._0_8_,local_510._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar6 = (pVVar26->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pIVar21 = (IVal *)local_510;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_520._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_588,(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)
                   ((long)(local_2b0.out0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_540),
                   (Vector<float,_4> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_588._M_dataplus._M_p,local_588._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  ((string *)(local_510 + 0x50),(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)local_510) {
          operator_delete((void *)local_520._0_8_,local_510._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar6 = (pVVar26->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pIVar21 = (IVal *)local_510;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_520._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_588,(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)
                   ((long)(local_2b0.out1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_540),
                   (Vector<float,_4> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_588._M_dataplus._M_p,local_588._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  ((string *)(local_510 + 0x50),(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)local_280,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)local_510) {
          operator_delete((void *)local_520._0_8_,local_510._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_420);
      }
      local_558 = (pointer)((long)local_558->m_data + 1);
    } while (local_558 != local_2c0);
  }
  pPVar10 = local_550;
  iVar14 = (int)local_528;
  if (100 < iVar14) {
    local_498._0_8_ = ((local_550->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(Skipped ",9);
    std::ostream::operator<<(poVar1,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_420);
  }
  if (iVar14 == 0) {
    local_498._0_8_ = ((pPVar10->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_498._0_8_ = ((pPVar10->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::ostream::operator<<(poVar1,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
  std::ios_base::~ios_base(local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_2b0.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b0.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}